

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmHexFileConverter.cxx
# Opt level: O1

bool OutputBin(FILE *file,char *buf,uint startIndex,uint stopIndex)

{
  int iVar1;
  size_t sVar2;
  size_t __n;
  uint uVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  char hexNumber [3];
  uint convertedByte;
  char outBuf [256];
  char local_147;
  char local_146;
  undefined1 local_145;
  undefined4 local_144;
  FILE *local_140;
  undefined1 local_138 [264];
  
  local_145 = 0;
  __n = 0;
  if (startIndex < stopIndex) {
    pcVar4 = buf + (long)(int)startIndex + 1;
    bVar6 = true;
    uVar3 = startIndex + 2;
    local_140 = (FILE *)file;
    do {
      local_147 = pcVar4[-1];
      local_146 = *pcVar4;
      local_144 = 0;
      iVar1 = __isoc99_sscanf(&local_147,"%x",&local_144);
      file = (FILE *)local_140;
      if (iVar1 != 1) {
        bVar6 = false;
        break;
      }
      local_138[__n] = (undefined1)local_144;
      __n = (size_t)((int)__n + 1);
      pcVar4 = pcVar4 + 2;
      bVar5 = uVar3 < stopIndex;
      uVar3 = uVar3 + 2;
    } while (bVar5);
  }
  else {
    bVar6 = true;
  }
  if (bVar6) {
    sVar2 = fwrite(local_138,1,__n,(FILE *)file);
    bVar6 = sVar2 == __n;
  }
  return bVar6;
}

Assistant:

static bool OutputBin(FILE* file, const char * buf,
                      unsigned int startIndex, unsigned int stopIndex)
{
  bool success = true;
  char hexNumber[3];
  hexNumber[2] = '\0';
  char outBuf[256];
  unsigned int outBufCount = 0;
  for (unsigned int i = startIndex; i < stopIndex; i += 2)
    {
    hexNumber[0] = buf[i];
    hexNumber[1] = buf[i+1];
    unsigned int convertedByte = 0;
    if (sscanf(hexNumber, "%x", &convertedByte) != 1)
      {
      success = false;
      break;
      }
    outBuf[outBufCount] = static_cast<char>(convertedByte & 0xff);
    outBufCount++;
    }
  if (success)
    {
    success = (fwrite(outBuf, 1, outBufCount, file)==outBufCount);
    }
  return success;
}